

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ReservoirQuantileBindData::Deserialize
          (Deserializer *deserializer,AggregateFunction *function)

{
  pointer pRVar1;
  _Head_base<0UL,_duckdb::ReservoirQuantileBindData_*,_false> local_20;
  
  make_uniq<duckdb::ReservoirQuantileBindData>();
  pRVar1 = unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
           ::operator->((unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::vector<double,true>>
            ((Deserializer *)function,100,"quantiles",&pRVar1->quantiles);
  pRVar1 = unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
           ::operator->((unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<unsigned_long>
            ((Deserializer *)function,0x65,"sample_size",&pRVar1->sample_size);
  deserializer->_vptr_Deserializer = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &function) {
		auto result = make_uniq<ReservoirQuantileBindData>();
		deserializer.ReadProperty(100, "quantiles", result->quantiles);
		deserializer.ReadProperty(101, "sample_size", result->sample_size);
		return std::move(result);
	}